

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.h
# Opt level: O0

void __thiscall axl::io::ShmtBase::~ShmtBase(ShmtBase *this)

{
  int in_ESI;
  ShmtBase *in_RDI;
  
  close(in_RDI,in_ESI);
  sys::NamedSemaphore::~NamedSemaphore((NamedSemaphore *)0x12ab78);
  sys::NamedSemaphore::~NamedSemaphore((NamedSemaphore *)0x12ab86);
  Mapping::~Mapping((Mapping *)in_RDI);
  File::~File((File *)0x12aba2);
  return;
}

Assistant:

~ShmtBase() {
		close();
	}